

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::AppendChild(Element *this,ElementPtr *child,bool dom_element)

{
  code *pcVar1;
  bool bVar2;
  int i;
  uint uVar3;
  Element *this_00;
  Element *pEVar4;
  
  this_00 = (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  if (this_00 == (Element *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(child)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x533);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_00 = (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  }
  if (dom_element) {
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::_M_insert_rval(&this->children,
                     (this->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -(long)this->num_non_dom_children,
                     child);
  }
  else {
    ::std::
    vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
    ::emplace_back<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>
              ((vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
                *)&this->children,child);
    this->num_non_dom_children = this->num_non_dom_children + 1;
  }
  SetParent(this_00,this);
  pEVar4 = this_00;
  for (uVar3 = 0; (pEVar4 != (Element *)0x0 && (uVar3 < 3)); uVar3 = uVar3 + 1) {
    (*(pEVar4->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])(pEVar4,this_00);
    pEVar4 = pEVar4->parent;
  }
  DirtyStackingContext(this);
  this->field_0x17 = this->field_0x17 | 2;
  if (dom_element) {
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
  }
  return this_00;
}

Assistant:

Element* Element::AppendChild(ElementPtr child, bool dom_element)
{
	RMLUI_ASSERT(child);
	Element* child_ptr = child.get();
	if (dom_element)
		children.insert(children.end() - num_non_dom_children, std::move(child));
	else
	{
		children.push_back(std::move(child));
		num_non_dom_children++;
	}
	// Set parent just after inserting into children. This allows us to eg. get our previous sibling in SetParent.
	child_ptr->SetParent(this);

	Element* ancestor = child_ptr;
	for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
		ancestor->OnChildAdd(child_ptr);

	DirtyStackingContext();

	// Not only does the element definition of the newly inserted element need to be dirtied, but also our own definition and implicitly all of our
	// children's. This ensures correct styles being applied in the presence of tree-structural selectors such as ':first-child'.
	DirtyDefinition(DirtyNodes::Self);

	if (dom_element)
		DirtyLayout();

	return child_ptr;
}